

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cpp
# Opt level: O1

Cursor * __thiscall Table::tableFind(Table *this,uint32_t key)

{
  NodeType NVar1;
  char *node;
  Cursor *pCVar2;
  
  node = Pager::getPage(this->pager,this->rootPageNum);
  NVar1 = get_node_type(node);
  if (NVar1 == NodeLeaf) {
    pCVar2 = leafNodeFind(this,this->rootPageNum,key);
    return pCVar2;
  }
  std::operator<<((ostream *)&std::cout,"Searching internal nodes not implemented yet.\n");
  exit(1);
}

Assistant:

Cursor* Table::tableFind(uint32_t key) {
	char *rootNode = pager->getPage(rootPageNum);

	if (get_node_type(rootNode) == NodeType::NodeLeaf) {
		return leafNodeFind(rootPageNum, key);
	} else {
		std::cout << "Searching internal nodes not implemented yet.\n";
		exit(EXIT_FAILURE);
	}
}